

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O3

int pt_insn_at_disabled_event(pt_event *ev,pt_insn *insn,pt_insn_ext *iext,pt_config *config)

{
  pt_insn_class pVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(ev == (pt_event *)0x0);
  auVar4._4_4_ = -(uint)(insn == (pt_insn *)0x0);
  auVar4._8_4_ = -(uint)(iext == (pt_insn_ext *)0x0);
  auVar4._12_4_ = -(uint)(config == (pt_config *)0x0);
  iVar2 = movmskps(in_EAX,auVar4);
  iVar3 = -1;
  if (iVar2 == 0) {
    if ((ev->field_0x4 & 1) == 0) {
      pVar1 = insn->iclass;
      if (pVar1 < (ptic_indirect|ptic_other)) {
        if ((0x5e8U >> (pVar1 & 0x1f) & 1) != 0) {
          return 1;
        }
        if ((0x14U >> (pVar1 & 0x1f) & 1) == 0) {
          if (pVar1 == ptic_error) {
            return -0xe;
          }
        }
        else {
          if ((iext->variant).branch.is_direct == '\0') {
            return 1;
          }
          if ((long)(iext->variant).branch.displacement + (ulong)insn->size + insn->ip ==
              (ev->variant).enabled.ip) {
            return 1;
          }
        }
      }
    }
    else {
      iVar2 = pt_insn_is_far_branch(insn,iext);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = pt_insn_changes_cpl(insn,iext);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = pt_insn_changes_cr3(insn,iext);
      if (iVar2 != 0) {
        return 1;
      }
      if ((((config->addr_filter).config.addr_cfg != 0) &&
          ((undefined1  [64])((undefined1  [64])config->errata & (undefined1  [64])0x20) !=
           (undefined1  [64])0x0)) &&
         (iVar2 = pt_insn_at_skl014((pt_event *)(ulong)*(uint *)&ev->field_0x4,insn,iext,config),
         iVar2 != 0)) {
        return 1;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int pt_insn_at_disabled_event(const struct pt_event *ev,
				     const struct pt_insn *insn,
				     const struct pt_insn_ext *iext,
				     const struct pt_config *config)
{
	if (!ev || !insn || !iext || !config)
		return -pte_internal;

	if (ev->ip_suppressed) {
		if (pt_insn_is_far_branch(insn, iext) ||
		    pt_insn_changes_cpl(insn, iext) ||
		    pt_insn_changes_cr3(insn, iext))
			return 1;

		/* If we don't have a filter configuration we assume that no
		 * address filters were used and the erratum does not apply.
		 *
		 * We might otherwise disable tracing too early.
		 */
		if (config->addr_filter.config.addr_cfg &&
		    config->errata.skl014 &&
		    pt_insn_at_skl014(ev, insn, iext, config))
			return 1;
	} else {
		switch (insn->iclass) {
		case ptic_ptwrite:
		case ptic_other:
			break;

		case ptic_call:
		case ptic_jump:
			/* If we got an IP with the disabled event, we may
			 * ignore direct branches that go to a different IP.
			 */
			if (iext->variant.branch.is_direct) {
				uint64_t ip;

				ip = insn->ip;
				ip += insn->size;
				ip += (uint64_t) (int64_t)
					iext->variant.branch.displacement;

				if (ip != ev->variant.disabled.ip)
					break;
			}

			fallthrough;
		case ptic_return:
		case ptic_far_call:
		case ptic_far_return:
		case ptic_far_jump:
		case ptic_indirect:
		case ptic_cond_jump:
			return 1;

		case ptic_unknown:
			return -pte_bad_insn;
		}
	}

	return 0;
}